

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O0

void __thiscall QDesktopUnixServices::setApplicationBadge(QDesktopUnixServices *this,qint64 number)

{
  initializer_list<QVariant> args;
  byte bVar1;
  bool bVar2;
  QMap<QString,_QVariant> *this_00;
  long in_FS_OFFSET;
  qint64 count;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str_5;
  char16_t *str_6;
  char16_t *str_7;
  QDBusMessage signal;
  QVariantMap dbusUnityProperties;
  QString launcherUrl;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QStringBuilder<QStringBuilder<QString,_QString>,_QString> *in_stack_fffffffffffffb48;
  QVariant *this_01;
  QStringBuilder<QStringBuilder<QString,_QString>,_QString> *in_stack_fffffffffffffb50;
  QVariant *pQVar3;
  QStringBuilder<QString,_QString> *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  QString *in_stack_fffffffffffffb70;
  QDBusMessage local_3b8 [32];
  QArrayDataPointer<char16_t> local_398 [2];
  QArrayDataPointer<char16_t> local_368;
  undefined1 local_350 [48];
  QArrayDataPointer<char16_t> local_320 [4];
  undefined1 local_2c0 [24];
  undefined1 *local_2a8;
  QArrayDataPointer<char16_t> local_2a0 [2];
  QArrayDataPointer<char16_t> local_270 [2];
  QArrayDataPointer<char16_t> local_240 [2];
  undefined1 *local_210;
  undefined4 local_208;
  undefined4 local_204;
  QArrayDataPointer<char16_t> local_200 [3];
  QArrayDataPointer<char16_t> local_1b8 [7];
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char local_f8 [64];
  undefined1 *local_b8;
  undefined1 *local_b0;
  QVariant local_a8;
  QVariant QStack_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::instance();
  QGuiApplication::desktopFileName();
  bVar1 = QString::isEmpty((QString *)0xac91c8);
  QString::~QString((QString *)0xac91d9);
  if ((bVar1 & 1) == 0) {
    local_110 = &DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    local_100 = &DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_1b8,(Data *)0x0,L"application://",0xe);
    QString::QString((QString *)in_stack_fffffffffffffb50,(DataPointer *)in_stack_fffffffffffffb48);
    QCoreApplication::instance();
    QGuiApplication::desktopFileName();
    ::operator+(&in_stack_fffffffffffffb58->a,(QString *)in_stack_fffffffffffffb50);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_200,(Data *)0x0,L".desktop",8);
    QString::QString((QString *)in_stack_fffffffffffffb50,(DataPointer *)in_stack_fffffffffffffb48);
    ::operator+(in_stack_fffffffffffffb58,(QString *)in_stack_fffffffffffffb50);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffb48);
    QStringBuilder<QStringBuilder<QString,_QString>,_QString>::~QStringBuilder
              (in_stack_fffffffffffffb50);
    QString::~QString((QString *)0xac93c5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffb50);
    QStringBuilder<QString,_QString>::~QStringBuilder(&in_stack_fffffffffffffb50->a);
    QString::~QString((QString *)0xac93ec);
    QString::~QString((QString *)0xac93f9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffb50);
    local_204 = 0;
    local_208 = 9999;
    this_00 = (QMap<QString,_QVariant> *)
              qBound<int,long_long>
                        ((int *)CONCAT17(bVar1,in_stack_fffffffffffffb60),
                         (longlong *)in_stack_fffffffffffffb58,(int *)in_stack_fffffffffffffb50);
    local_210 = &DAT_aaaaaaaaaaaaaaaa;
    QMap<QString,_QVariant>::QMap((QMap<QString,_QVariant> *)0xac945a);
    if ((long)this_00 < 1) {
      ::QVariant::QVariant(&local_68,false);
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_2a0,(Data *)0x0,L"count-visible",0xd);
      QString::QString((QString *)in_stack_fffffffffffffb50,(DataPointer *)in_stack_fffffffffffffb48
                      );
      QMap<QString,_QVariant>::operator[](this_00,in_stack_fffffffffffffb70);
      ::QVariant::operator=
                ((QVariant *)in_stack_fffffffffffffb58,(QVariant *)in_stack_fffffffffffffb50);
      QString::~QString((QString *)0xac9682);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffb50);
      ::QVariant::~QVariant(&local_68);
    }
    else {
      ::QVariant::QVariant(&local_28,(longlong)this_00);
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_240,(Data *)0x0,L"count",5);
      QString::QString((QString *)in_stack_fffffffffffffb50,(DataPointer *)in_stack_fffffffffffffb48
                      );
      QMap<QString,_QVariant>::operator[](this_00,in_stack_fffffffffffffb70);
      ::QVariant::operator=
                ((QVariant *)in_stack_fffffffffffffb58,(QVariant *)in_stack_fffffffffffffb50);
      QString::~QString((QString *)0xac9500);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffb50);
      ::QVariant::~QVariant(&local_28);
      ::QVariant::QVariant(&local_48,true);
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_270,(Data *)0x0,L"count-visible",0xd);
      QString::QString((QString *)in_stack_fffffffffffffb50,(DataPointer *)in_stack_fffffffffffffb48
                      );
      QMap<QString,_QVariant>::operator[](this_00,in_stack_fffffffffffffb70);
      ::QVariant::operator=
                ((QVariant *)in_stack_fffffffffffffb58,(QVariant *)in_stack_fffffffffffffb50);
      QString::~QString((QString *)0xac95c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffb50);
      ::QVariant::~QVariant(&local_48);
    }
    local_2a8 = &DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_320,(Data *)0x0,L"/com/canonical/unity/launcherentry/",0x23);
    QString::QString((QString *)in_stack_fffffffffffffb50,(DataPointer *)in_stack_fffffffffffffb48);
    QCoreApplication::instance();
    QCoreApplication::applicationName();
    ::operator+(&in_stack_fffffffffffffb58->a,(QString *)in_stack_fffffffffffffb50);
    ::QStringBuilder::operator_cast_to_QString(&in_stack_fffffffffffffb48->a);
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_368,(Data *)0x0,L"com.canonical.Unity.LauncherEntry",0x21);
    QString::QString((QString *)in_stack_fffffffffffffb50,(DataPointer *)in_stack_fffffffffffffb48);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_398,(Data *)0x0,L"Update",6);
    QString::QString((QString *)in_stack_fffffffffffffb50,(DataPointer *)in_stack_fffffffffffffb48);
    QDBusMessage::createSignal((QString *)&local_2a8,(QString *)local_2c0,(QString *)local_350);
    QString::~QString((QString *)0xac9847);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffb50);
    QString::~QString((QString *)0xac9861);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffb50);
    QString::~QString((QString *)0xac987b);
    QStringBuilder<QString,_QString>::~QStringBuilder(&in_stack_fffffffffffffb50->a);
    QString::~QString((QString *)0xac9895);
    QString::~QString((QString *)0xac98a2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffb50);
    ::QVariant::QVariant(&local_a8,(QString *)&local_110);
    ::QVariant::QVariant(&QStack_88,(QMap_conflict *)&local_210);
    args._M_array._7_1_ = bVar1;
    args._M_array._0_7_ = in_stack_fffffffffffffb60;
    args._M_len = (size_type)&local_a8;
    QList<QVariant>::QList((QList<QVariant> *)in_stack_fffffffffffffb58,args);
    QDBusMessage::setArguments((QList_conflict3 *)&local_2a8);
    QList<QVariant>::~QList((QList<QVariant> *)0xac992c);
    pQVar3 = &local_a8;
    this_01 = &local_68;
    do {
      this_01 = this_01 + -1;
      ::QVariant::~QVariant(this_01);
    } while (this_01 != pQVar3);
    QDBusConnection::sessionBus();
    QDBusConnection::send(local_3b8);
    QDBusConnection::~QDBusConnection((QDBusConnection *)local_3b8);
    QDBusMessage::~QDBusMessage((QDBusMessage *)&local_2a8);
    QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0xac99b0);
    QString::~QString((QString *)0xac99bd);
  }
  else {
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaServices();
    anon_unknown.dwarf_1d508dd::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffffb50,
               (QLoggingCategory *)in_stack_fffffffffffffb48);
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_b8), bVar2) {
      anon_unknown.dwarf_1d508dd::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xac9239);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(bVar1,in_stack_fffffffffffffb60),
                 (char *)in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                 (char *)in_stack_fffffffffffffb48,(char *)0xac9252);
      QMessageLogger::warning
                (local_f8,"Cannot set badge number - QGuiApplication::desktopFileName() is empty");
      local_b0 = (undefined1 *)((ulong)local_b0 & 0xffffffffffffff00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDesktopUnixServices::setApplicationBadge(qint64 number)
{
#if QT_CONFIG(dbus)
    if (qGuiApp->desktopFileName().isEmpty()) {
        qCWarning(lcQpaServices, "Cannot set badge number - QGuiApplication::desktopFileName() is empty");
        return;
    }


    const QString launcherUrl = QStringLiteral("application://") + qGuiApp->desktopFileName() + QStringLiteral(".desktop");
    const qint64 count = qBound(0, number, 9999);
    QVariantMap dbusUnityProperties;

    if (count > 0) {
        dbusUnityProperties[QStringLiteral("count")] = count;
        dbusUnityProperties[QStringLiteral("count-visible")] = true;
    } else {
        dbusUnityProperties[QStringLiteral("count-visible")] = false;
    }

    auto signal = QDBusMessage::createSignal(QStringLiteral("/com/canonical/unity/launcherentry/")
        + qGuiApp->applicationName(), QStringLiteral("com.canonical.Unity.LauncherEntry"), QStringLiteral("Update"));

    signal.setArguments({launcherUrl, dbusUnityProperties});

    QDBusConnection::sessionBus().send(signal);
#else
    Q_UNUSED(number)
#endif
}